

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Glucose::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  uint cr;
  uint *puVar1;
  bool bVar2;
  long lVar3;
  Clause *c;
  long lVar4;
  int local_34;
  
  if (0 < cs->sz) {
    lVar4 = 0;
    local_34 = 0;
    do {
      puVar1 = cs->data;
      cr = puVar1[lVar4];
      c = (Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
      bVar2 = satisfied(this,c);
      if (bVar2) {
        removeClause(this,cr,((c->header).field_0x1 & 4) != 0);
      }
      else {
        lVar3 = (long)local_34;
        local_34 = local_34 + 1;
        puVar1[lVar3] = cr;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < cs->sz);
    if (0 < (int)lVar4 - local_34) {
      cs->sz = (local_34 + cs->sz) - (int)lVar4;
    }
  }
  return;
}

Assistant:

void Solver::removeSatisfied(vec <CRef> &cs) {

    int i, j;
    for(i = j = 0; i < cs.size(); i++) {
        Clause &c = ca[cs[i]];


        if(satisfied(c)) if(c.getOneWatched())
            removeClause(cs[i], true);
        else
            removeClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    cs.shrink(i - j);
}